

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_storePC(sysbvm_bytecodeJit_t *jit,uint16_t pc)

{
  uint16_t pc_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  sysbvm_jit_x86_movImmediateI32IntoMemory64WithOffset(jit,SYSBVM_X86_EBP,jit->pcOffset,pc);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_storePC(sysbvm_bytecodeJit_t *jit, uint16_t pc)
{
    sysbvm_jit_x86_movImmediateI32IntoMemory64WithOffset(jit, SYSBVM_X86_RBP, jit->pcOffset, pc);
}